

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedTest::Check
          (GetVertexArrayIndexedTest *this,GLenum pname,GLuint index,GLint expected)

{
  ostringstream *poVar1;
  int iVar2;
  undefined4 extraout_var;
  GLint result;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xb80))(this->m_vao,index,pname);
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  local_1c8.m_value = pname;
  if (iVar2 == 0) {
    if (expected == 0) {
      return true;
    }
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GetVertexArrayIndexediv called with index ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and with pname",0xf);
    local_1c8.m_getName = glu::getVertexAttribParameterNameName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," returned ",10);
    std::ostream::operator<<(poVar1,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", but ",6);
    std::ostream::operator<<(poVar1,expected);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," was expected. Test fails.",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GetVertexArrayIndexediv called with index ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", with pname",0xc);
    local_1c8.m_getName = glu::getVertexAttribParameterNameName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," unexpectedly generated ",0x18);
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"error. Test fails.",0x12);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool GetVertexArrayIndexedTest::Check(const glw::GLenum pname, const glw::GLuint index, const glw::GLint expected)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint result = 0;

	gl.getVertexArrayIndexediv(m_vao, index, pname, &result);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayIndexediv called with index "
											<< index << ", with pname" << glu::getVertexAttribParameterNameStr(pname)
											<< " unexpectedly generated " << glu::getErrorStr(error)
											<< "error. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	if (result != expected)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetVertexArrayIndexediv called with index "
											<< index << " and with pname" << glu::getVertexAttribParameterNameStr(pname)
											<< " returned " << result << ", but " << expected
											<< " was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}